

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::DefParamSymbol::serializeTo(DefParamSymbol *this,ASTSerializer *serializer)

{
  Symbol *value;
  ConstantValue *__n;
  string_view name;
  
  value = getTarget(this);
  if (value != (Symbol *)0x0) {
    name._M_str = "target";
    name._M_len = 6;
    ASTSerializer::writeLink(serializer,name,value);
  }
  __n = getValue(this);
  ASTSerializer::write(serializer,5,"value",(size_t)__n);
  return;
}

Assistant:

void DefParamSymbol::serializeTo(ASTSerializer& serializer) const {
    if (auto t = getTarget())
        serializer.writeLink("target", *t);
    serializer.write("value", getValue());
}